

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_brief_primary_actions::module_start(module_brief_primary_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)module);
  std::operator<<(poVar1,"\n");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->m_,module);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << module << "\n";
        m_.insert( module );
    }